

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O3

ConstIterator * __thiscall
iDynTree::SensorsList::ConstIterator::operator++
          (ConstIterator *__return_storage_ptr__,ConstIterator *this,int param_1)

{
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar1;
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  *pvVar2;
  pointer ppSVar3;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar4;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar5;
  Sensor **ppSVar6;
  
  __return_storage_ptr__->iteratingList = this->iteratingList;
  pvVar1 = (this->externalIterator)._M_current;
  (__return_storage_ptr__->internalIterator)._M_current = (this->internalIterator)._M_current;
  (__return_storage_ptr__->externalIterator)._M_current = pvVar1;
  pvVar1 = (this->externalIterator)._M_current;
  ppSVar6 = (this->internalIterator)._M_current + 1;
  (this->internalIterator)._M_current = ppSVar6;
  if ((pvVar1->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish <= ppSVar6) {
    pvVar2 = this->iteratingList;
    do {
      pvVar5 = pvVar1 + 1;
      (this->externalIterator)._M_current = pvVar5;
      if (pvVar5 == (pvVar2->
                    super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        return __return_storage_ptr__;
      }
      ppSVar3 = (pvVar5->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = pvVar1 + 1;
      pvVar1 = pvVar5;
    } while (ppSVar3 ==
             (pvVar4->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
    (this->internalIterator)._M_current = ppSVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

SensorsList::ConstIterator SensorsList::ConstIterator::operator++(int)
    {
        SensorsList::ConstIterator previous(*this);
        this->operator++();
        return previous;
    }